

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Own<capnp::_::SegmentBuilder> * __thiscall
kj::Vector<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
          (Vector<kj::Own<capnp::_::SegmentBuilder>> *this,Own<capnp::_::SegmentBuilder> *params)

{
  SegmentBuilder *pSVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  
  pOVar2 = *(Own<capnp::_::SegmentBuilder> **)(this + 8);
  if (pOVar2 == *(Own<capnp::_::SegmentBuilder> **)(this + 0x10)) {
    Vector<kj::Own<capnp::_::SegmentBuilder>_>::grow
              ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)this,0);
    pOVar2 = *(Own<capnp::_::SegmentBuilder> **)(this + 8);
  }
  pSVar1 = params->ptr;
  pOVar2->disposer = params->disposer;
  pOVar2->ptr = pSVar1;
  params->ptr = (SegmentBuilder *)0x0;
  *(Own<capnp::_::SegmentBuilder> **)(this + 8) = pOVar2 + 1;
  return pOVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }